

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

void TransposeTest(void)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int level;
  undefined8 uVar6;
  timespec ts_1;
  word N [64];
  word M [64];
  timespec local_438;
  timespec local_428 [32];
  word local_228 [64];
  
  Aig_ManRandom64(1);
  lVar3 = 0;
  do {
    local_228[lVar3] = -(ulong)(lVar3 == 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  iVar2 = clock_gettime(3,local_428);
  if (iVar2 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_428[0].tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_428[0].tv_sec * -1000000;
  }
  iVar2 = 0;
  do {
    memset(local_428,0,0x200);
    lVar4 = 0;
    do {
      uVar1 = local_228[lVar4];
      uVar5 = 0;
      do {
        if ((uVar1 >> (uVar5 & 0x3f) & 1) != 0) {
          (&local_428[0].tv_sec)[uVar5] =
               (&local_428[0].tv_sec)[uVar5] | 0x8000000000000000U >> ((byte)lVar4 & 0x3f);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x40);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x186a1);
  level = 3;
  iVar2 = clock_gettime(3,&local_438);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_438.tv_nsec / 1000 + local_438.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  iVar2 = clock_gettime(3,&local_438);
  if (iVar2 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_438.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_438.tv_sec * -1000000;
  }
  iVar2 = 0x186a1;
  do {
    transpose64(local_228);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  uVar6 = 3;
  iVar2 = clock_gettime(3,&local_438);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_438.tv_nsec / 1000 + local_438.tv_sec * 1000000;
  }
  Abc_Print((int)uVar6,"%s =","Time");
  Abc_Print((int)uVar6,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  lVar3 = 0;
  do {
    if (local_228[lVar3] != (&local_428[0].tv_sec)[lVar3]) {
      Abc_Print((int)uVar6,"Mismatch\n");
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

void TransposeTest()
{
    word M[64], N[64];
    int i;
    abctime clk;
    Aig_ManRandom64( 1 );
//    for ( i = 0; i < 64; i++ )
//        M[i] = Aig_ManRandom64( 0 );
    for ( i = 0; i < 64; i++ )
        M[i] = i? (word)0 : ~(word)0;
//    for ( i = 0; i < 64; i++ )
//        Extra_PrintBinary( stdout, (unsigned *)&M[i], 64 ), Abc_Print( 1, "\n" );

    clk = Abc_Clock();
    for ( i = 0; i < 100001; i++ )
        transpose64Simple( M, N );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    for ( i = 0; i < 100001; i++ )
        transpose64( M );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    for ( i = 0; i < 64; i++ )
        if ( M[i] != N[i] )
            Abc_Print( 1, "Mismatch\n" );
/*
    Abc_Print( 1, "\n" );
    for ( i = 0; i < 64; i++ )
        Extra_PrintBinary( stdout, (unsigned *)&M[i], 64 ), Abc_Print( 1, "\n" );
    Abc_Print( 1, "\n" );
    for ( i = 0; i < 64; i++ )
        Extra_PrintBinary( stdout, (unsigned *)&N[i], 64 ), Abc_Print( 1, "\n" );
*/
}